

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  string *this_00;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  string local_48 [32];
  char *local_28;
  
  std::__cxx11::string::string(local_48,(string *)name);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_28 = error;
  this_00 = (string *)operator_new(0x28);
  std::__cxx11::string::string(this_00,local_48);
  *(char **)(this_00 + 0x20) = local_28;
  pcStack_50 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx:488:5)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx:488:5)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)this_00;
  AddBuiltinCommand(this,name,(Command *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(
    name,
    [name, error](std::vector<cmListFileArgument> const&,
                  cmExecutionStatus& status) -> bool {
      cmValue versionValue =
        status.GetMakefile().GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
      if (name == "endif" &&
          (!versionValue || atof(versionValue->c_str()) <= 1.4)) {
        return true;
      }
      status.SetError(error);
      return false;
    });
}